

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<int>::SolveJacobi
          (TPZMatrix<int> *this,int64_t *numiterations,TPZFMatrix<int> *F,TPZFMatrix<int> *result,
          TPZFMatrix<int> *residual,TPZFMatrix<int> *scratch,REAL *tol,int FromCurrent)

{
  int *piVar1;
  long lVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if (FromCurrent == 0) {
    TPZFMatrix<int>::operator=(scratch,F);
    (*(result->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  else {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  iVar4 = Dot<int>(scratch,scratch);
  dVar3 = (double)iVar4;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (0 < *numiterations) {
    lVar2 = (F->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
    lVar7 = 0;
    do {
      if (ABS((double)(int)dVar3) < *tol || ABS((double)(int)dVar3) == *tol) break;
      if (0 < lVar2) {
        lVar10 = 0;
        lVar8 = 0;
        do {
          if (0 < CONCAT44(extraout_var,iVar4)) {
            lVar9 = 0;
            do {
              if (((scratch->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow <= lVar9) ||
                 ((scratch->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar8)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              iVar6 = *(int *)((long)scratch->fElem +
                              lVar9 * 4 +
                              (scratch->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow * lVar10);
              iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                (this,lVar9,lVar9);
              if (((result->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow <= lVar9) ||
                 ((result->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar8)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              piVar1 = (int *)((long)result->fElem +
                              lVar9 * 4 +
                              (result->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow * lVar10);
              *piVar1 = *piVar1 + iVar6 / iVar5;
              lVar9 = lVar9 + 1;
            } while (CONCAT44(extraout_var,iVar4) != lVar9);
          }
          lVar8 = lVar8 + 1;
          lVar10 = lVar10 + 4;
        } while (lVar8 != lVar2);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
      iVar6 = Dot<int>(scratch,scratch);
      dVar3 = (double)iVar6;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *numiterations);
  }
  if (residual != (TPZFMatrix<int> *)0x0) {
    TPZFMatrix<int>::operator=(residual,scratch);
    return;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}